

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_strpbrk(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxi32 sVar1;
  sxu32 local_58;
  sxi32 rc;
  sxu32 nMax;
  sxu32 nOfft;
  int c;
  int i;
  int iListLen;
  int iLen;
  char *zEnd;
  char *zList;
  char *zString;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zString = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 2) {
    jx9_result_bool(pCtx,0);
  }
  else {
    zList = jx9_value_to_string(*apArg,&i);
    zEnd = jx9_value_to_string(*(jx9_value **)(zString + 8),&c);
    if (i < 1) {
      jx9_result_bool(pjStack_18,0);
    }
    else {
      _iListLen = zList + i;
      local_58 = 0xffffffff;
      rc = -1;
      for (nOfft = 0; (int)nOfft < c; nOfft = nOfft + 1) {
        nMax = (sxu32)zEnd[(int)nOfft];
        sVar1 = SyByteFind(zList,i,nMax,&local_58);
        if ((sVar1 == 0) && (local_58 < (uint)rc)) {
          rc = local_58;
        }
      }
      if (rc == -1) {
        jx9_result_bool(pjStack_18,0);
      }
      else {
        jx9_result_string(pjStack_18,zList + (uint)rc,(int)_iListLen - ((int)zList + rc));
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_strpbrk(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zList, *zEnd;
	int iLen, iListLen, i, c;
	sxu32 nOfft, nMax;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the haystack and the char list */
	zString = jx9_value_to_string(apArg[0], &iLen);
	zList = jx9_value_to_string(apArg[1], &iListLen);
	if( iLen < 1 ){
		/* Nothing to process, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the end of the string */
	zEnd = &zString[iLen];
	nOfft = nMax = SXU32_HIGH;
	/* perform the requested operation */
	for( i = 0 ; i < iListLen ; i++ ){
		c = zList[i];
		rc = SyByteFind(zString, (sxu32)iLen, c, &nMax);
		if( rc == SXRET_OK ){
			if( nMax < nOfft ){
				nOfft = nMax;
			}
		}
	}
	if( nOfft == SXU32_HIGH ){
		/* No such substring, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		/* Return the substring */
		jx9_result_string(pCtx, &zString[nOfft], (int)(zEnd-&zString[nOfft]));
	}
	return JX9_OK;
}